

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<QLoggingCategory*,QtMsgType>::tryEmplace_impl<QLoggingCategory*const&,QtMsgType&>
          (QHash<QLoggingCategory_*,_QtMsgType> *this,QLoggingCategory **key,QtMsgType *args)

{
  piter it;
  iterator it_00;
  bool bVar1;
  bool bVar2;
  size_t bucket_00;
  QtMsgType *in_RCX;
  QLoggingCategory **in_RDX;
  long *in_RSI;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<QLoggingCategory_*,_QtMsgType> detachGuard;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *in_stack_ffffffffffffff18;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *in_stack_ffffffffffffff20;
  Node<QLoggingCategory_*,_QtMsgType> *in_stack_ffffffffffffff28;
  QHash<QLoggingCategory_*,_QtMsgType> *in_stack_ffffffffffffff30;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *local_c8;
  size_t in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar3;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *this_00;
  Bucket local_30;
  Bucket local_20;
  QHash<QLoggingCategory_*,_QtMsgType> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (*in_RSI == 0) {
    QHash<QLoggingCategory_*,_QtMsgType>::detach
              ((QHash<QLoggingCategory_*,_QtMsgType> *)in_stack_ffffffffffffff20);
  }
  local_10.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QLoggingCategory_*,_QtMsgType>::QHash(&local_10);
  QHashPrivate::calculateHash<QLoggingCategory*>
            ((QLoggingCategory **)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
  local_20.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory*,QtMsgType>>::
             findBucketWithHash<QLoggingCategory*>
                       (this_00,(QLoggingCategory **)in_RDI,
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  bVar1 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::Bucket::isUnused
                    ((Bucket *)0x2dbe43);
  bVar2 = QHash<QLoggingCategory_*,_QtMsgType>::isDetached
                    ((QHash<QLoggingCategory_*,_QtMsgType> *)in_stack_ffffffffffffff20);
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::
                         shouldGrow((Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)
                                    *in_RSI), bVar2)))) {
    QHash<QLoggingCategory_*,_QtMsgType>::operator=
              (in_stack_ffffffffffffff30,
               (QHash<QLoggingCategory_*,_QtMsgType> *)in_stack_ffffffffffffff28);
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::shouldGrow
                        ((Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)*in_RSI);
    }
    uVar3 = bVar2;
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::Bucket::
                toBucketIndex(&local_20,
                              (Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)*in_RSI);
    if (bVar2 == false) {
      local_c8 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::detached
                           ((Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)
                            CONCAT17(uVar3,in_stack_ffffffffffffff48));
    }
    else {
      local_c8 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::detached
                           ((Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)
                            CONCAT17(uVar3,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40);
    }
    *in_RSI = (long)local_c8;
    if (bVar2 == false) {
      QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::Bucket::Bucket
                (&local_30,(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)*in_RSI,
                 bucket_00);
    }
    else {
      local_30 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory*,QtMsgType>>::
                 findBucketWithHash<QLoggingCategory*>
                           (this_00,(QLoggingCategory **)in_RDI,
                            CONCAT17(uVar3,in_stack_ffffffffffffff48));
    }
    local_20 = local_30;
  }
  if (bVar1) {
    in_stack_ffffffffffffff28 =
         QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::Bucket::insert
                   ((Bucket *)0x2dbfe9);
    QHashPrivate::Node<QLoggingCategory*,QtMsgType>::createInPlace<QtMsgType&>
              (in_stack_ffffffffffffff28,in_RDX,in_RCX);
    *(long *)(*in_RSI + 8) = *(long *)(*in_RSI + 8) + 1;
  }
  QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::Bucket::toIterator
            ((Bucket *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  it.bucket = (size_t)in_stack_ffffffffffffff28;
  it.d = in_stack_ffffffffffffff20;
  QHash<QLoggingCategory_*,_QtMsgType>::iterator::iterator((iterator *)in_stack_ffffffffffffff18,it)
  ;
  it_00.i.bucket = (size_t)in_stack_ffffffffffffff28;
  it_00.i.d = in_stack_ffffffffffffff20;
  QHash<QLoggingCategory_*,_QtMsgType>::TryEmplaceResult::TryEmplaceResult
            ((TryEmplaceResult *)in_stack_ffffffffffffff18,it_00,false);
  QHash<QLoggingCategory_*,_QtMsgType>::~QHash
            ((QHash<QLoggingCategory_*,_QtMsgType> *)in_stack_ffffffffffffff20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (TryEmplaceResult *)this_00;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }